

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O0

void __thiscall xLearn::SquaredLoss::CalcGrad(SquaredLoss *this,DMatrix *matrix,Model *model)

{
  ostream *poVar1;
  ThreadPool *this_00;
  DMatrix **__args;
  Model **__args_1;
  vector<float,_std::allocator<float>_> *this_01;
  vector<float,_std::allocator<float>_> *pvVar2;
  reference pvVar3;
  Score **__args_2;
  long in_RSI;
  long in_RDI;
  int i_1;
  size_t end;
  size_t start;
  int i;
  vector<float,_std::allocator<float>_> sum;
  int count;
  size_t row_len;
  allocator_type *in_stack_fffffffffffffd68;
  Logger *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd78;
  bool *__args_3;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd80;
  _func_void_DMatrix_ptr_Model_ptr_Score_ptr_bool_float_ptr_uint_uint *in_stack_fffffffffffffd98;
  float **__args_4;
  unsigned_long *in_stack_fffffffffffffdb8;
  unsigned_long *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int line;
  string *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  LogSeverity severity;
  _Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>
  *in_stack_fffffffffffffe20;
  allocator *paVar4;
  ThreadPool *in_stack_fffffffffffffe28;
  int local_17c;
  int local_104;
  vector<float,_std::allocator<float>_> local_f8;
  int local_dc;
  ulong local_d8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  Logger local_80;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c [3];
  long local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  if (in_RSI == 0) {
    Logger::Logger(local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"CalcGrad",&local_79);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffde8,line,in_stack_fffffffffffffdd8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x76);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"matrix");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger(in_stack_fffffffffffffd70);
    abort();
  }
  if (*(int *)(in_RSI + 0x10) == 0) {
    local_10 = in_RSI;
    Logger::Logger(&local_80,ERR);
    paVar4 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,paVar4);
    paVar4 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"CalcGrad",paVar4);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffde8,line,in_stack_fffffffffffffdd8);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x77);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"matrix->row_length");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(local_10 + 0x10));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"0");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Logger::~Logger(in_stack_fffffffffffffd70);
    abort();
  }
  local_d8 = (ulong)*(uint *)(in_RSI + 0x10);
  *(uint *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + *(uint *)(in_RSI + 0x10);
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    __args_4 = (float **)0x1;
  }
  else {
    __args_4 = *(float ***)(in_RDI + 0x20);
  }
  local_dc = (int)__args_4;
  this_00 = (ThreadPool *)(long)local_dc;
  std::allocator<float>::allocator((allocator<float> *)0x1a567c);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             (value_type_conflict *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::allocator<float>::~allocator((allocator<float> *)0x1a56aa);
  for (local_104 = 0; local_104 < local_dc; local_104 = local_104 + 1) {
    in_stack_fffffffffffffd98 =
         (_func_void_DMatrix_ptr_Model_ptr_Score_ptr_bool_float_ptr_uint_uint *)
         getStart(local_d8,(long)local_dc,(long)local_104);
    __args = (DMatrix **)getEnd(local_d8,(long)local_dc,(long)local_104);
    __args_3 = *(bool **)(in_RDI + 0x18);
    __args_2 = (Score **)(in_RDI + 8);
    __args_1 = (Model **)(in_RDI + 0x10);
    std::vector<float,_std::allocator<float>_>::operator[](&local_f8,(long)local_104);
    std::
    bind<void(&)(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int),xLearn::DMatrix_const*&,xLearn::Model*,xLearn::Score*&,bool&,float*,unsigned_long&,unsigned_long&>
              (in_stack_fffffffffffffd98,__args,__args_1,__args_2,__args_3,__args_4,
               in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    ThreadPool::
    enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::future<void>::~future((future<void> *)0x1a57fd);
  }
  ThreadPool::Sync(this_00,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  local_17c = 0;
  while( true ) {
    this_01 = (vector<float,_std::allocator<float>_> *)(long)local_17c;
    pvVar2 = (vector<float,_std::allocator<float>_> *)
             std::vector<float,_std::allocator<float>_>::size(&local_f8);
    if (pvVar2 <= this_01) break;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_f8,(long)local_17c);
    *(float *)(in_RDI + 0x28) = *pvVar3 + *(float *)(in_RDI + 0x28);
    local_17c = local_17c + 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector(this_01);
  return;
}

Assistant:

void SquaredLoss::CalcGrad(const DMatrix* matrix,
                           Model& model) {
  CHECK_NOTNULL(matrix);
  CHECK_GT(matrix->row_length, 0);
  size_t row_len = matrix->row_length;
  total_example_ += row_len;
  int count = lock_free_ ? threadNumber_ : 1;
  std::vector<real_t> sum(count, 0);
  for (int i = 0; i < count; ++i) {
    size_t start = getStart(row_len, count, i);
    size_t end = getEnd(row_len, count, i);
    pool_->enqueue(std::bind(sq_gradient_thread,
                             matrix,
                             &model,
                             score_func_,
                             norm_,
                             &(sum[i]),
                             start,
                             end));
  }
  // Wait all of the threads finish their job
  pool_->Sync(count);
  // Accumulate loss
  for (int i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}